

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDitheringTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles3::Functional::DitheringCase::drawAndCheckGradient
          (DitheringCase *this,bool isVerticallyIncreasing,Vec4 *highColor)

{
  RenderContext *context;
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  bool bVar4;
  deUint32 seed;
  int iVar5;
  int iVar6;
  int iVar7;
  GLenum GVar8;
  deBool dVar9;
  char *pcVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  MessageBuilder *pMVar11;
  int local_bc4;
  deUint32 local_bac;
  int local_b58;
  deUint32 local_b54;
  int local_b4c;
  int local_ad0;
  float local_ac4;
  char *local_a90;
  int local_9d0;
  deUint32 local_9cc;
  char *local_9c8;
  MessageBuilder local_9c0;
  RGBA local_83c;
  int local_838;
  RGBA clr;
  int y_1;
  int x_1;
  int constPos;
  RGBA prevConstantDirectionPix;
  int incrPos;
  bool colorHasChanged;
  int constantDirectionSize;
  int increasingDirectionSize;
  string local_810;
  allocator<char> local_7e9;
  string local_7e8;
  LogImage local_7c8;
  deUint32 local_734;
  MessageBuilder local_730;
  deUint32 local_5b0;
  RGBA local_5ac;
  Vector<float,_4> local_5a8;
  Vector<float,_4> local_598;
  undefined1 local_588 [8];
  Vec4 inputClr;
  float inputF;
  int x;
  int y;
  bool colorChoicesOk;
  Surface errorMask;
  string local_548;
  allocator<char> local_521;
  string local_520;
  LogImage local_500;
  PixelBufferAccess local_470;
  char *local_448;
  MessageBuilder local_440;
  char *local_2c0;
  MessageBuilder local_2b8;
  undefined1 local_138 [8];
  Surface renderedImg;
  Quad quad;
  Vec4 *quadClr1;
  Vec4 quadClr0;
  int viewportY;
  int viewportX;
  int viewportHei;
  int viewportWid;
  int maxViewportHei;
  int maxViewportWid;
  Random rnd;
  TestLog *log;
  Vec4 *highColor_local;
  bool isVerticallyIncreasing_local;
  DitheringCase *this_local;
  
  rnd.m_rnd._8_8_ = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  pcVar10 = tcu::TestNode::getName((TestNode *)this);
  seed = deStringHash(pcVar10);
  de::Random::Random((Random *)&maxViewportHei,seed);
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar5 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar5));
  iVar5 = de::min<int>(iVar5,0x100);
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar6 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_00,iVar6));
  iVar6 = de::min<int>(iVar6,0x100);
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar7 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var_01,iVar7));
  quadClr0.m_data[3] = (float)de::Random::getInt((Random *)&maxViewportHei,0,iVar7 - iVar5);
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar7 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_02,iVar7));
  quadClr0.m_data[2] = (float)de::Random::getInt((Random *)&maxViewportHei,0,iVar7 - iVar6);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&quadClr1,0.0,0.0,0.0,0.0);
  deqp::gls::FragmentOpUtil::Quad::Quad((Quad *)&renderedImg.m_pixels.m_cap);
  tcu::Surface::Surface((Surface *)local_138,iVar5,iVar6);
  do {
    glwViewport((GLint)quadClr0.m_data[3],(GLint)quadClr0.m_data[2],iVar5,iVar6);
    GVar8 = glwGetError();
    glu::checkError(GVar8,"glViewport(viewportX, viewportY, viewportWid, viewportHei)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDitheringTests.cpp"
                    ,0xfe);
    dVar9 = ::deGetFalse();
  } while (dVar9 != 0);
  tcu::TestLog::operator<<
            (&local_2b8,(TestLog *)rnd.m_rnd._8_8_,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar11 = tcu::MessageBuilder::operator<<(&local_2b8,(char (*) [14])"Dithering is ");
  local_2c0 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
  if ((this->m_ditheringEnabled & 1U) != 0) {
    local_2c0 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
  }
  local_2c0 = local_2c0 + 0x27;
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_2c0);
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_2b8);
  if ((this->m_ditheringEnabled & 1U) == 0) {
    do {
      glwDisable(0xbd0);
      GVar8 = glwGetError();
      glu::checkError(GVar8,"glDisable(GL_DITHER)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDitheringTests.cpp"
                      ,0x105);
      dVar9 = ::deGetFalse();
    } while (dVar9 != 0);
  }
  else {
    do {
      glwEnable(0xbd0);
      GVar8 = glwGetError();
      glu::checkError(GVar8,"glEnable(GL_DITHER)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDitheringTests.cpp"
                      ,0x103);
      dVar9 = ::deGetFalse();
    } while (dVar9 != 0);
  }
  tcu::TestLog::operator<<
            (&local_440,(TestLog *)rnd.m_rnd._8_8_,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar11 = tcu::MessageBuilder::operator<<(&local_440,(char (*) [11])"Drawing a ");
  local_448 = "horizontally";
  if (isVerticallyIncreasing) {
    local_448 = "vertically";
  }
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_448);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [21])" increasing gradient");
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_440);
  deqp::gls::FragmentOpUtil::QuadRenderer::render
            (this->m_renderer,(Quad *)&renderedImg.m_pixels.m_cap);
  fVar2 = quadClr0.m_data[3];
  fVar1 = quadClr0.m_data[2];
  context = this->m_renderCtx;
  tcu::Surface::getAccess(&local_470,(Surface *)local_138);
  glu::readPixels(context,(int)fVar2,(int)fVar1,&local_470);
  GVar8 = glwGetError();
  glu::checkError(GVar8,"glReadPixels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDitheringTests.cpp"
                  ,0x111);
  uVar3 = rnd.m_rnd._8_8_;
  if (isVerticallyIncreasing) {
    local_a90 = "VerGradient";
  }
  else {
    local_a90 = "HorGradient";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,local_a90,&local_521);
  pcVar10 = "Horizontal gradient";
  if (isVerticallyIncreasing) {
    pcVar10 = "Vertical gradient";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_548,pcVar10,(allocator<char> *)((long)&errorMask.m_pixels.m_cap + 7));
  tcu::LogImage::LogImage
            (&local_500,&local_520,&local_548,(Surface *)local_138,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<((TestLog *)uVar3,&local_500);
  tcu::LogImage::~LogImage(&local_500);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator((allocator<char> *)((long)&errorMask.m_pixels.m_cap + 7));
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator(&local_521);
  tcu::Surface::Surface((Surface *)&y,iVar5,iVar6);
  x._3_1_ = 1;
  for (inputF = 0.0; fVar1 = inputF, iVar5 = tcu::Surface::getHeight((Surface *)local_138),
      uVar3 = rnd.m_rnd._8_8_, (int)fVar1 < iVar5; inputF = (float)((int)inputF + 1)) {
    for (inputClr.m_data[3] = 0.0; fVar1 = inputClr.m_data[3],
        iVar5 = tcu::Surface::getWidth((Surface *)local_138), (int)fVar1 < iVar5;
        inputClr.m_data[3] = (float)((int)inputClr.m_data[3] + 1)) {
      if (isVerticallyIncreasing) {
        local_ac4 = inputF;
      }
      else {
        local_ac4 = inputClr.m_data[3];
      }
      if (isVerticallyIncreasing) {
        local_ad0 = tcu::Surface::getHeight((Surface *)local_138);
      }
      else {
        local_ad0 = tcu::Surface::getWidth((Surface *)local_138);
      }
      inputClr.m_data[2] = ((float)(int)local_ac4 + 0.5) / (float)local_ad0;
      tcu::operator*((tcu *)&local_598,1.0 - inputClr.m_data[2],(Vector<float,_4> *)&quadClr1);
      tcu::operator*((tcu *)&local_5a8,inputClr.m_data[2],highColor);
      tcu::operator+((tcu *)local_588,&local_598,&local_5a8);
      local_5ac = tcu::Surface::getPixel((Surface *)local_138,(int)inputClr.m_data[3],(int)inputF);
      bVar4 = checkColor(this,(Vec4 *)local_588,&local_5ac,(bool)(x._3_1_ & 1));
      fVar2 = inputF;
      fVar1 = inputClr.m_data[3];
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        local_734 = (deUint32)tcu::RGBA::green();
        tcu::Surface::setPixel((Surface *)&y,(int)fVar1,(int)fVar2,(RGBA)local_734);
      }
      else {
        local_5b0 = (deUint32)tcu::RGBA::red();
        tcu::Surface::setPixel((Surface *)&y,(int)fVar1,(int)fVar2,(RGBA)local_5b0);
        if ((x._3_1_ & 1) != 0) {
          tcu::TestLog::operator<<
                    (&local_730,(TestLog *)rnd.m_rnd._8_8_,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar11 = tcu::MessageBuilder::operator<<
                              (&local_730,(char (*) [25])"First failure at pixel (");
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(int *)(inputClr.m_data + 3));
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a3caab);
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(int *)&inputF);
          pMVar11 = tcu::MessageBuilder::operator<<
                              (pMVar11,(char (*) [32])") (not printing further errors)");
          tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_730);
          x._3_1_ = 0;
        }
      }
    }
  }
  bVar4 = (x._3_1_ & 1) != 0;
  if (!bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7e8,"ColorChoiceErrorMask",&local_7e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_810,"Error mask for color choices",
               (allocator<char> *)((long)&increasingDirectionSize + 3));
    tcu::LogImage::LogImage
              (&local_7c8,&local_7e8,&local_810,(Surface *)&y,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<((TestLog *)uVar3,&local_7c8);
    tcu::LogImage::~LogImage(&local_7c8);
    std::__cxx11::string::~string((string *)&local_810);
    std::allocator<char>::~allocator((allocator<char> *)((long)&increasingDirectionSize + 3));
    std::__cxx11::string::~string((string *)&local_7e8);
    std::allocator<char>::~allocator(&local_7e9);
    this_local._7_1_ = 0;
  }
  tcu::Surface::~Surface((Surface *)&y);
  if (bVar4) {
    if ((this->m_ditheringEnabled & 1U) == 0) {
      if (isVerticallyIncreasing) {
        iVar5 = tcu::Surface::getHeight((Surface *)local_138);
        local_b4c = tcu::Surface::getWidth((Surface *)local_138);
      }
      else {
        iVar5 = tcu::Surface::getWidth((Surface *)local_138);
        local_b4c = tcu::Surface::getHeight((Surface *)local_138);
      }
      prevConstantDirectionPix.m_value._3_1_ = 0;
      for (constPos = 0; constPos < iVar5; constPos = constPos + 1) {
        tcu::RGBA::RGBA((RGBA *)&x_1);
        for (y_1 = 0; y_1 < local_b4c; y_1 = y_1 + 1) {
          if (isVerticallyIncreasing) {
            local_b54 = y_1;
          }
          else {
            local_b54 = constPos;
          }
          clr.m_value = local_b54;
          if (isVerticallyIncreasing) {
            local_b58 = constPos;
          }
          else {
            local_b58 = y_1;
          }
          local_838 = local_b58;
          local_83c = tcu::Surface::getPixel((Surface *)local_138,local_b54,local_b58);
          if ((0 < y_1) && (bVar4 = tcu::RGBA::operator!=(&local_83c,(RGBA *)&x_1), bVar4)) {
            if ((prevConstantDirectionPix.m_value._3_1_ & 1) != 0) {
              tcu::TestLog::operator<<
                        (&local_9c0,(TestLog *)rnd.m_rnd._8_8_,
                         (BeginMessageToken *)&tcu::TestLog::Message);
              pMVar11 = tcu::MessageBuilder::operator<<
                                  (&local_9c0,
                                   (char (*) [40])"Failure: colors should be constant per ");
              local_9c8 = "column";
              if (isVerticallyIncreasing) {
                local_9c8 = "row";
              }
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_9c8);
              pMVar11 = tcu::MessageBuilder::operator<<
                                  (pMVar11,(char (*) [60])
                                           " (since dithering is disabled), but the color at position ("
                                  );
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(int *)&clr);
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a3caab);
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_838);
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [6])") is ");
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_83c);
              pMVar11 = tcu::MessageBuilder::operator<<
                                  (pMVar11,(char (*) [35])" and does not equal the color at (");
              if (isVerticallyIncreasing) {
                local_bac = clr.m_value - 1;
              }
              else {
                local_bac = clr.m_value;
              }
              local_9cc = local_bac;
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(int *)&local_9cc);
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a3caab);
              if (isVerticallyIncreasing) {
                local_bc4 = local_838;
              }
              else {
                local_bc4 = local_838 + -1;
              }
              local_9d0 = local_bc4;
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_9d0);
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])0x2b79c45);
              pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(RGBA *)&x_1);
              tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_9c0);
              this_local._7_1_ = 0;
              goto LAB_01d9e64f;
            }
            prevConstantDirectionPix.m_value._3_1_ = 1;
          }
          x_1 = local_83c.m_value;
        }
      }
    }
    this_local._7_1_ = 1;
  }
LAB_01d9e64f:
  tcu::Surface::~Surface((Surface *)local_138);
  de::Random::~Random((Random *)&maxViewportHei);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool DitheringCase::drawAndCheckGradient (const bool isVerticallyIncreasing, const Vec4& highColor) const
{
	TestLog&					log					= m_testCtx.getLog();
	Random						rnd					(deStringHash(getName()));
	const int					maxViewportWid		= 256;
	const int					maxViewportHei		= 256;
	const int					viewportWid			= de::min(m_renderCtx.getRenderTarget().getWidth(), maxViewportWid);
	const int					viewportHei			= de::min(m_renderCtx.getRenderTarget().getHeight(), maxViewportHei);
	const int					viewportX			= rnd.getInt(0, m_renderCtx.getRenderTarget().getWidth() - viewportWid);
	const int					viewportY			= rnd.getInt(0, m_renderCtx.getRenderTarget().getHeight() - viewportHei);
	const Vec4					quadClr0			(0.0f, 0.0f, 0.0f, 0.0f);
	const Vec4&					quadClr1			= highColor;
	Quad						quad;
	Surface						renderedImg			(viewportWid, viewportHei);

	GLU_CHECK_CALL(glViewport(viewportX, viewportY, viewportWid, viewportHei));

	log << TestLog::Message << "Dithering is " << (m_ditheringEnabled ? "enabled" : "disabled") << TestLog::EndMessage;

	if (m_ditheringEnabled)
		GLU_CHECK_CALL(glEnable(GL_DITHER));
	else
		GLU_CHECK_CALL(glDisable(GL_DITHER));

	log << TestLog::Message << "Drawing a " << (isVerticallyIncreasing ? "vertically" : "horizontally") << " increasing gradient" << TestLog::EndMessage;

	quad.color[0] = quadClr0;
	quad.color[1] = isVerticallyIncreasing ? quadClr1 : quadClr0;
	quad.color[2] = isVerticallyIncreasing ? quadClr0 : quadClr1;
	quad.color[3] = quadClr1;

	m_renderer->render(quad);

	glu::readPixels(m_renderCtx, viewportX, viewportY, renderedImg.getAccess());
	GLU_CHECK_MSG("glReadPixels()");

	log << TestLog::Image(isVerticallyIncreasing ? "VerGradient"		: "HorGradient",
						  isVerticallyIncreasing ? "Vertical gradient"	: "Horizontal gradient",
						  renderedImg);

	// Validate, at each pixel, that each color channel is one of its two allowed values.

	{
		Surface		errorMask		(viewportWid, viewportHei);
		bool		colorChoicesOk	= true;

		for (int y = 0; y < renderedImg.getHeight(); y++)
		{
			for (int x = 0; x < renderedImg.getWidth(); x++)
			{
				const float		inputF		= ((float)(isVerticallyIncreasing ? y : x) + 0.5f) / (float)(isVerticallyIncreasing ? renderedImg.getHeight() : renderedImg.getWidth());
				const Vec4		inputClr	= (1.0f-inputF)*quadClr0 + inputF*quadClr1;

				if (!checkColor(inputClr, renderedImg.getPixel(x, y), colorChoicesOk))
				{
					errorMask.setPixel(x, y, tcu::RGBA::red());

					if (colorChoicesOk)
					{
						log << TestLog::Message << "First failure at pixel (" << x << ", " << y << ") (not printing further errors)" << TestLog::EndMessage;
						colorChoicesOk = false;
					}
				}
				else
					errorMask.setPixel(x, y, tcu::RGBA::green());
			}
		}

		if (!colorChoicesOk)
		{
			log << TestLog::Image("ColorChoiceErrorMask", "Error mask for color choices", errorMask);
			return false;
		}
	}

	// When dithering is disabled, the color selection must be coordinate-independent - i.e. the colors must be constant in the gradient's constant direction.

	if (!m_ditheringEnabled)
	{
		const int	increasingDirectionSize	= isVerticallyIncreasing ? renderedImg.getHeight() : renderedImg.getWidth();
		const int	constantDirectionSize	= isVerticallyIncreasing ? renderedImg.getWidth() : renderedImg.getHeight();
		bool		colorHasChanged			= false;

		for (int incrPos = 0; incrPos < increasingDirectionSize; incrPos++)
		{
			tcu::RGBA prevConstantDirectionPix;
			for (int constPos = 0; constPos < constantDirectionSize; constPos++)
			{
				const int			x		= isVerticallyIncreasing ? constPos : incrPos;
				const int			y		= isVerticallyIncreasing ? incrPos : constPos;
				const tcu::RGBA		clr		= renderedImg.getPixel(x, y);

				if (constPos > 0 && clr != prevConstantDirectionPix)
				{
					if (colorHasChanged)
					{
						log << TestLog::Message
							<< "Failure: colors should be constant per " << (isVerticallyIncreasing ? "row" : "column")
							<< " (since dithering is disabled), but the color at position (" << x << ", " << y << ") is " << clr
							<< " and does not equal the color at (" << (isVerticallyIncreasing ? x-1 : x) << ", " << (isVerticallyIncreasing ? y : y-1) << "), which is " << prevConstantDirectionPix
							<< TestLog::EndMessage;

						return false;
					}
					else
						colorHasChanged = true;
				}

				prevConstantDirectionPix = clr;
			}
		}
	}

	return true;
}